

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O2

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::allocate
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *pc,void *addr,size_t size)

{
  size_t address;
  void *local_58;
  iterator local_50;
  
  local_58 = addr;
  std::__shared_mutex_pthread::lock(&(this->g_lock)._M_impl);
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::find<unsigned_long>
            (&local_50,
             (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)&this->allocs,(key_arg<unsigned_long> *)&local_58);
  if (local_50.inner_ == (Inner *)0x0) {
    create_alloc(this,(size_t)local_58,size);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->g_lock);
  return;
}

Assistant:

void allocate(tls_t tls, void* pc, void* addr, size_t size) final {
#if REGARD_ALLOCS
    size_t address = reinterpret_cast<size_t>(addr);
    std::lock_guard<LockT> exLockT(g_lock);
    if (allocs.find(address) == allocs.end()) {
      create_alloc(address, size);
    }
#endif
  }